

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

void helicsTranslatorSetInfo(HelicsTranslator trans,char *info,HelicsError *err)

{
  Interface *this;
  HelicsTranslator pvVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  string_view info_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (trans == (HelicsTranslator)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b3fc4;
    }
    else {
      bVar4 = *(int *)((long)trans + 4) == -0x4c83cad2;
      pvVar1 = (HelicsTranslator)0x0;
      if (bVar4) {
        pvVar1 = trans;
      }
      if (bVar4 || err == (HelicsError *)0x0) goto LAB_001b3fc6;
    }
    err->error_code = -3;
    err->message = "The given translator object is not valid";
  }
LAB_001b3fc4:
  pvVar1 = (HelicsTranslator)0x0;
LAB_001b3fc6:
  if (pvVar1 != (HelicsTranslator)0x0) {
    this = *(Interface **)((long)pvVar1 + 8);
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (info != (char *)0x0) {
      sVar2 = strlen(info);
      _Var3._M_p = info;
    }
    info_00._M_str = _Var3._M_p;
    info_00._M_len = sVar2;
    helics::Interface::setInfo(this,info_00);
  }
  return;
}

Assistant:

void helicsTranslatorSetInfo(HelicsTranslator trans, const char* info, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setInfo(AS_STRING_VIEW(info));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}